

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeyore_dump.cpp
# Opt level: O0

ostream * operator<<(ostream *out,ee_expr_op *op)

{
  ostream *poVar1;
  char *pcVar2;
  ee_expr_op *op_local;
  ostream *out_local;
  
  if (op->numop == 1) {
    if (op->op == 0x10e) {
      poVar1 = std::operator<<(out,"  ");
      poVar1 = operator<<(poVar1,&op->sym);
      poVar1 = std::operator<<(poVar1," = ");
      poVar1 = operator<<(poVar1,&op->b);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar1 = std::operator<<(out,"  ");
      poVar1 = operator<<(poVar1,&op->sym);
      poVar1 = std::operator<<(poVar1," = ");
      pcVar2 = opname2str(op->op);
      poVar1 = std::operator<<(poVar1,pcVar2);
      poVar1 = operator<<(poVar1,&op->a);
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar1 = std::operator<<(out,"  ");
    poVar1 = operator<<(poVar1,&op->sym);
    poVar1 = std::operator<<(poVar1," = ");
    poVar1 = operator<<(poVar1,&op->a);
    poVar1 = std::operator<<(poVar1," ");
    pcVar2 = opname2str(op->op);
    poVar1 = std::operator<<(poVar1,pcVar2);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = operator<<(poVar1,&op->b);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return out;
}

Assistant:

DEFOUT(const ee_expr_op &op) {
  if(op.numop == 1) {
    if(op.op == OP_ADD) out << "  " << op.sym << " = " << op.b << endl;
    else out << "  " << op.sym << " = " << opname2str(op.op) << op.a << endl;
  }
  else {
    out << "  " << op.sym << " = " << op.a << " " << opname2str(op.op) << " " << op.b << endl;
  }
  return out;
}